

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

void __thiscall
capnp::anon_unknown_69::WindowFlowController::taskFailed
          (WindowFlowController *this,Exception *exception)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception> local_1c8;
  
  if ((this->state).tag == 1) {
    lVar1 = *(long *)((long)&(this->state).field_1 + 8);
    for (lVar3 = *(long *)&(this->state).field_1; lVar3 != lVar1; lVar3 = lVar3 + 0x10) {
      puVar2 = *(undefined8 **)(lVar3 + 8);
      kj::Exception::Exception((Exception *)&local_1c8,exception);
      (**(code **)*puVar2)(puVar2,&local_1c8);
      kj::Exception::~Exception((Exception *)&local_1c8);
    }
    local_1c8.tag = 2;
    local_1c8.field_1._0_8_ = (exception->ownFile).content.ptr;
    local_1c8.field_1._8_8_ = (exception->ownFile).content.size_;
    local_1c8.field_1._16_8_ = (exception->ownFile).content.disposer;
    (exception->ownFile).content.ptr = (char *)0x0;
    (exception->ownFile).content.size_ = 0;
    local_1c8.field_1._24_8_ = exception->file;
    local_1c8.field_1._32_4_ = exception->line;
    local_1c8.field_1._36_4_ = exception->type;
    local_1c8.field_1._40_8_ = (exception->description).content.ptr;
    local_1c8.field_1._48_8_ = (exception->description).content.size_;
    (exception->description).content.ptr = (char *)0x0;
    (exception->description).content.size_ = 0;
    local_1c8.field_1._56_8_ = (exception->description).content.disposer;
    local_1c8.field_1._64_8_ = (exception->context).ptr.disposer;
    local_1c8.field_1._72_8_ = (exception->context).ptr.ptr;
    local_1c8.field_1._80_8_ = (exception->remoteTrace).content.ptr;
    (exception->context).ptr.ptr = (Context *)0x0;
    local_1c8.field_1._88_8_ = (exception->remoteTrace).content.size_;
    local_1c8.field_1._96_8_ = (exception->remoteTrace).content.disposer;
    (exception->remoteTrace).content.ptr = (char *)0x0;
    (exception->remoteTrace).content.size_ = 0;
    memcpy((void *)((long)&local_1c8.field_1 + 0x68),exception->trace,0x105);
    local_1c8.field_1._368_8_ = (exception->details).builder.ptr;
    local_1c8.field_1._376_8_ = (exception->details).builder.pos;
    local_1c8.field_1._384_8_ = (exception->details).builder.endPtr;
    local_1c8.field_1._392_8_ = (exception->details).builder.disposer;
    (exception->details).builder.endPtr = (Detail *)0x0;
    (exception->details).builder.ptr = (Detail *)0x0;
    (exception->details).builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    kj::OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception>::
    operator=(&this->state,&local_1c8);
    kj::OneOf<kj::Vector<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>,_kj::Exception>::
    destroy(&local_1c8);
  }
  return;
}

Assistant:

void taskFailed(kj::Exception&& exception) override {
    KJ_SWITCH_ONEOF(state) {
      KJ_CASE_ONEOF(blockedSends, Running) {
        // Fail out all pending sends.
        for (auto& fulfiller: blockedSends) {
          fulfiller->reject(kj::cp(exception));
        }
        // Fail out all future sends.
        state = kj::mv(exception);
      }
      KJ_CASE_ONEOF(exception, kj::Exception) {
        // ignore redundant exception
      }
    }
  }